

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::SetCommentInfo::Deserialize(SetCommentInfo *this,Deserializer *deserializer)

{
  SetCommentInfo *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::SetCommentInfo_*,_false> local_20;
  
  this_00 = (SetCommentInfo *)operator_new(0xb8);
  SetCommentInfo(this_00);
  local_20._M_head_impl = this_00;
  pSVar1 = unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>::
           operator->((unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::CatalogType>
            (deserializer,300,"entry_catalog_type",&(pSVar1->super_AlterInfo).field_0x71);
  pSVar1 = unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>::
           operator->((unique_ptr<duckdb::SetCommentInfo,_std::default_delete<duckdb::SetCommentInfo>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::Value>
            (deserializer,0x12d,"comment_value",&pSVar1->comment_value);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> SetCommentInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetCommentInfo>(new SetCommentInfo());
	deserializer.ReadProperty<CatalogType>(300, "entry_catalog_type", result->entry_catalog_type);
	deserializer.ReadProperty<Value>(301, "comment_value", result->comment_value);
	return std::move(result);
}